

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-shutdown-after-write.c
# Opt level: O2

int run_test_tcp_shutdown_after_write(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_20;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_timer_init(puVar2,&timer);
    if (iVar1 == 0) {
      iVar1 = uv_timer_start(&timer,timer_cb,0x7d,0);
      if (iVar1 == 0) {
        iVar1 = uv_tcp_init(puVar2,&conn);
        if (iVar1 == 0) {
          iVar1 = uv_tcp_connect(&connect_req,&conn,(sockaddr *)&addr,connect_cb);
          if (iVar1 == 0) {
            iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
            if (iVar1 == 0) {
              if (connect_cb_called == 1) {
                if (write_cb_called == 1) {
                  if (shutdown_cb_called == 1) {
                    if (conn_close_cb_called == 1) {
                      if (timer_close_cb_called == 1) {
                        puVar2 = uv_default_loop();
                        uv_walk(puVar2,close_walk_cb,(void *)0x0);
                        uv_run(puVar2,UV_RUN_DEFAULT);
                        puVar2 = uv_default_loop();
                        iVar1 = uv_loop_close(puVar2);
                        if (iVar1 == 0) {
                          return 0;
                        }
                        pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                        uStack_20 = 0x88;
                      }
                      else {
                        pcVar3 = "timer_close_cb_called == 1";
                        uStack_20 = 0x86;
                      }
                    }
                    else {
                      pcVar3 = "conn_close_cb_called == 1";
                      uStack_20 = 0x85;
                    }
                  }
                  else {
                    pcVar3 = "shutdown_cb_called == 1";
                    uStack_20 = 0x84;
                  }
                }
                else {
                  pcVar3 = "write_cb_called == 1";
                  uStack_20 = 0x83;
                }
              }
              else {
                pcVar3 = "connect_cb_called == 1";
                uStack_20 = 0x82;
              }
            }
            else {
              pcVar3 = "r == 0";
              uStack_20 = 0x80;
            }
          }
          else {
            pcVar3 = "r == 0";
            uStack_20 = 0x7d;
          }
        }
        else {
          pcVar3 = "r == 0";
          uStack_20 = 0x77;
        }
      }
      else {
        pcVar3 = "r == 0";
        uStack_20 = 0x74;
      }
    }
    else {
      pcVar3 = "r == 0";
      uStack_20 = 0x71;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uStack_20 = 0x6d;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-shutdown-after-write.c"
          ,uStack_20,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(tcp_shutdown_after_write) {
  struct sockaddr_in addr;
  uv_loop_t* loop;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  loop = uv_default_loop();

  r = uv_timer_init(loop, &timer);
  ASSERT(r == 0);

  r = uv_timer_start(&timer, timer_cb, 125, 0);
  ASSERT(r == 0);

  r = uv_tcp_init(loop, &conn);
  ASSERT(r == 0);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT(r == 0);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(connect_cb_called == 1);
  ASSERT(write_cb_called == 1);
  ASSERT(shutdown_cb_called == 1);
  ASSERT(conn_close_cb_called == 1);
  ASSERT(timer_close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}